

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceManager.cpp
# Opt level: O0

bool __thiscall ResourceManager::add(ResourceManager *this,Resource *res,bool load)

{
  ulong uVar1;
  byte in_DL;
  value_type *in_RSI;
  vector<Resource_*,_std::allocator<Resource_*>_> *in_RDI;
  bool local_1;
  
  std::vector<Resource_*,_std::allocator<Resource_*>_>::push_back(in_RDI,in_RSI);
  if (((in_DL & 1) == 0) || (uVar1 = (*(code *)(*in_RSI)[1]._vptr_Resource)(), (uVar1 & 1) != 0)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ResourceManager::add(Resource* res, bool load)
{
   // We have to add the resource even if loading fails, if we want to be able
   // to continue without the resource (e.g. samples).
   resources.push_back(res);
   if (load) {
      if (!res->load())
         return false;
   }
   return true;
}